

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_hlsl.cpp
# Opt level: O0

string * __thiscall
spirv_cross::CompilerHLSL::layout_for_member_abi_cxx11_
          (string *__return_storage_ptr__,CompilerHLSL *this,SPIRType *type,uint32_t index)

{
  bool bVar1;
  allocator local_46;
  allocator local_45 [16];
  allocator local_35;
  uint32_t local_34;
  Bitset *local_30;
  Bitset *flags;
  SPIRType *pSStack_20;
  uint32_t index_local;
  SPIRType *type_local;
  CompilerHLSL *this_local;
  
  flags._4_4_ = index;
  pSStack_20 = type;
  type_local = (SPIRType *)this;
  this_local = (CompilerHLSL *)__return_storage_ptr__;
  local_34 = (uint32_t)TypedID::operator_cast_to_TypedID((TypedID *)&(type->super_IVariant).self);
  local_30 = Compiler::get_member_decoration_bitset((Compiler *)this,(TypeID)local_34,flags._4_4_);
  bVar1 = Bitset::get(local_30,5);
  if (bVar1) {
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)__return_storage_ptr__,"row_major ",&local_35);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_35);
  }
  else {
    bVar1 = Bitset::get(local_30,4);
    if (bVar1) {
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string((string *)__return_storage_ptr__,"column_major ",local_45);
      ::std::allocator<char>::~allocator((allocator<char> *)local_45);
    }
    else {
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string((string *)__return_storage_ptr__,"",&local_46);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_46);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

string CompilerHLSL::layout_for_member(const SPIRType &type, uint32_t index)
{
	auto &flags = get_member_decoration_bitset(type.self, index);

	// HLSL can emit row_major or column_major decoration in any struct.
	// Do not try to merge combined decorations for children like in GLSL.

	// Flip the convention. HLSL is a bit odd in that the memory layout is column major ... but the language API is "row-major".
	// The way to deal with this is to multiply everything in inverse order, and reverse the memory layout.
	if (flags.get(DecorationColMajor))
		return "row_major ";
	else if (flags.get(DecorationRowMajor))
		return "column_major ";

	return "";
}